

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O2

bool __thiscall minibag::Player::pauseCallback(Player *this,Request *req,Response *res)

{
  _data_type _Var1;
  char *pcVar2;
  bool bVar3;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  _Var1 = req->data;
  this->requested_pause_state_ = _Var1 != '\0';
  bVar3 = (bool)_Var1 == this->paused_;
  this->pause_change_requested_ = !bVar3;
  res->success = !bVar3;
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Bag is already ",&local_51);
    pcVar2 = "running.";
    if (this->requested_pause_state_ != false) {
      pcVar2 = "paused.";
    }
    std::operator+(&local_30,&local_50,pcVar2);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Playback is now ",&local_51);
    pcVar2 = "resumed";
    if (this->requested_pause_state_ != false) {
      pcVar2 = "paused";
    }
    std::operator+(&local_30,&local_50,pcVar2);
  }
  std::__cxx11::string::operator=((string *)&res->message,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return true;
}

Assistant:

bool Player::pauseCallback(std_srvs::SetBool::Request &req, std_srvs::SetBool::Response &res)
{
  pause_change_requested_ = (req.data != paused_);
  requested_pause_state_ = req.data;

  res.success = pause_change_requested_;

  if (res.success)
  {
    res.message = std::string("Playback is now ") + (requested_pause_state_ ? "paused" : "resumed");
  }
  else
  {
    res.message = std::string("Bag is already ") + (requested_pause_state_ ? "paused." : "running.");
  }

  return true;
}